

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O2

void __thiscall ExportEmitArray_Array_Test::TestBody(ExportEmitArray_Array_Test *this)

{
  int __fd;
  ostream_base *poVar1;
  string *psVar2;
  AssertionResult *__n;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX_00;
  void *__buf_02;
  int iVar3;
  char *message;
  pointer piVar4;
  initializer_list<int> __l;
  AssertionResult gtest_ar;
  AssertHelper local_c8;
  Message local_c0;
  string actual;
  vector<int,_std::allocator<int>_> values;
  ostringstream os;
  
  __n = &gtest_ar;
  pstore::exchange::export_ns::ostringstream::ostringstream(&os);
  actual._M_dataplus._M_p = (pointer)0x300000002;
  actual._M_string_length._0_4_ = 5;
  __l._M_len = 3;
  __l._M_array = (iterator)&actual;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,(allocator_type *)&gtest_ar);
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0;
  pstore::exchange::export_ns::ostream_base::write
            (&os.super_ostream_base,0x1c755c,__buf,(size_t)__n);
  __buf_00 = extraout_RDX;
  iVar3 = 0x1c5bef;
  __fd = 0x1c5bef;
  for (piVar4 = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start;
      piVar4 != values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_finish; piVar4 = piVar4 + 1) {
    poVar1 = (ostream_base *)
             pstore::exchange::export_ns::ostream_base::write
                       (&os.super_ostream_base,iVar3,__buf_00,(size_t)__n);
    pstore::exchange::export_ns::ostream_base::write(poVar1,10,__buf_01,(size_t)__n);
    iVar3 = *piVar4;
    actual._M_dataplus._M_p._0_4_ = 1;
    poVar1 = pstore::exchange::export_ns::operator<<(&os.super_ostream_base,(indent *)&actual);
    pstore::exchange::export_ns::ostream_base::write<int,void,void>(poVar1,iVar3);
    gtest_ar.success_ = false;
    gtest_ar._1_3_ = 0;
    __buf_00 = extraout_RDX_00;
    iVar3 = 0x1bbf7a;
    __fd = 0x1c5bee;
  }
  poVar1 = (ostream_base *)
           pstore::exchange::export_ns::ostream_base::write
                     (&os.super_ostream_base,__fd,__buf_00,(size_t)__n);
  poVar1 = pstore::exchange::export_ns::operator<<(poVar1,(indent *)&gtest_ar);
  pstore::exchange::export_ns::ostream_base::write(poVar1,0x1bbf78,__buf_02,(size_t)__n);
  psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&os);
  std::__cxx11::string::string((string *)&actual,(string *)psVar2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[18]>
            ((internal *)&gtest_ar,"actual","\"[\\n  2,\\n  3,\\n  5\\n]\"",&actual,
             (char (*) [18])"[\n  2,\n  3,\n  5\n]");
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_emit.cpp"
               ,0x56,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_c0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&actual);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&os);
  return;
}

Assistant:

TEST (ExportEmitArray, Array) {
    pstore::exchange::export_ns::ostringstream os;
    std::vector<int> values{2, 3, 5};
    emit_array (os, pstore::exchange::export_ns::indent{}, std::begin (values), std::end (values),
                [] (pstore::exchange::export_ns::ostringstream & os1,
                    pstore::exchange::export_ns::indent ind, int v) { os1 << ind << v; });
    auto const actual = os.str ();
    EXPECT_EQ (actual, "[\n  2,\n  3,\n  5\n]");
}